

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

DenseVector *
google::protobuf::internal::GenericTypeHandler<CoreML::Specification::DenseVector>::New
          (Arena *arena)

{
  Arena *arena_local;
  DenseVector *local_28;
  DenseVector *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (DenseVector *)operator_new(0x28);
    CoreML::Specification::DenseVector::DenseVector(local_28);
  }
  else {
    local_28 = (DenseVector *)
               Arena::AllocateAligned
                         (arena,(type_info *)&CoreML::Specification::DenseVector::typeinfo,0x28);
    CoreML::Specification::DenseVector::DenseVector(local_28);
    Arena::AddListNode(arena,local_28,arena_destruct_object<CoreML::Specification::DenseVector>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }